

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *this,
          TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *gel)

{
  long lVar1;
  TPZGeoElSide gelside;
  TPZGeoElSide thisside;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018970b0;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_01891580,&gel->super_TPZGeoEl);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_01891280;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::TPZGeoBlend(&this->fGeo,&gel->fGeo);
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1f8);
  lVar1 = 0;
  do {
    TPZGeoElSide::TPZGeoElSide
              (&local_48,
               (TPZGeoElSideIndex *)
               ((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1),
               (this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::TPZGeoElSide
              (&local_60,
               (TPZGeoElSideIndex *)
               ((long)&gel->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1),
               (this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::SetConnectivity(&local_48,&local_60);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1f8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(const TPZGeoElRefLess<TGeo>  &gel)
:TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(gel), fGeo(gel.fGeo){
	int i;
	for(i=0;i<TGeo::NSides;i++){
		TPZGeoElSide thisside(this->fNeighbours[i], this->Mesh());
		TPZGeoElSide gelside(gel.fNeighbours[i], this->Mesh());
		thisside.SetConnectivity(gelside);
		//     fNeighbours[i].SetConnectivity(gel.fNeighbours[i]);
	}
	//  fSubElement = -1;
}